

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O3

Result * validateWeightParamsUpdatable(Result *__return_storage_ptr__,NeuralNetworkLayer *layer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ConvolutionLayerParams *pCVar3;
  byte bVar4;
  long *plVar5;
  Result *extraout_RAX;
  Result *pRVar6;
  RepeatedField<unsigned_long> *pRVar7;
  long *plVar8;
  byte bVar9;
  bool bVar10;
  undefined1 *puVar11;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [40];
  char *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  long lStack_48;
  string local_40;
  
  CoreML::Result::Result((Result *)local_88);
  paVar2 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar2;
  if (layer->_oneof_case_[0] == 0x8c) {
    pCVar3 = (layer->layer_).convolution_;
    bVar4 = *(byte *)&(pCVar3->stride_).arena_or_elements_;
    if (bVar4 == 1) {
      puVar11 = (undefined1 *)(pCVar3->kernelsize_).arena_or_elements_;
      if (puVar11 == (undefined1 *)0x0) {
        puVar11 = CoreML::Specification::_WeightParams_default_instance_;
      }
      bVar9 = puVar11[0x40];
      bVar10 = *(long *)(puVar11 + 0x38) != 0 &&
               puVar11 != CoreML::Specification::_WeightParams_default_instance_;
    }
    else {
      bVar9 = 0;
      bVar10 = false;
    }
    pRVar7 = &pCVar3->kernelsize_;
LAB_003060b3:
    puVar11 = *(undefined1 **)pRVar7;
    if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
      puVar11 = CoreML::Specification::_WeightParams_default_instance_;
    }
    if ((puVar11 != CoreML::Specification::_WeightParams_default_instance_ &&
         ((WeightParams *)puVar11)->quantization_ != (QuantizationParams *)0x0) || (bVar10)) {
      std::operator+(&local_a8,"An updatable layer, named \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_a8);
    }
    else {
      if (((byte)(bVar9 | bVar4 ^ 1) == 1) && (((WeightParams *)puVar11)->isupdatable_ != false))
      goto LAB_003060f1;
      std::operator+(&local_a8,"An updatable layer, named \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_a8);
    }
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_58._8_8_ = *plVar8;
      lStack_48 = plVar5[3];
      local_60 = local_58._M_local_buf + 8;
    }
    else {
      local_58._8_8_ = *plVar8;
      local_60 = (char *)*plVar5;
    }
    local_58._M_allocated_capacity = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_60);
    if (local_60 != local_58._M_local_buf + 8) {
      operator_delete(local_60,local_58._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_PARAMETERS,&local_40);
  }
  else {
    if (layer->_oneof_case_[0] == 100) {
      pCVar3 = (layer->layer_).convolution_;
      bVar4 = pCVar3->hasbias_;
      if ((bool)bVar4 == true) {
        puVar11 = (undefined1 *)pCVar3->bias_;
        if ((WeightParams *)puVar11 == (WeightParams *)0x0) {
          puVar11 = CoreML::Specification::_WeightParams_default_instance_;
        }
        bVar9 = ((WeightParams *)puVar11)->isupdatable_;
        bVar10 = ((WeightParams *)puVar11)->quantization_ != (QuantizationParams *)0x0 &&
                 puVar11 != CoreML::Specification::_WeightParams_default_instance_;
      }
      else {
        bVar9 = 0;
        bVar10 = false;
      }
      pRVar7 = (RepeatedField<unsigned_long> *)&pCVar3->weights_;
      goto LAB_003060b3;
    }
LAB_003060f1:
    __return_storage_ptr__->m_type = local_88._0_4_;
    __return_storage_ptr__->m_reason = local_88._4_4_;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((Result *)local_88._8_8_ == (Result *)(local_88 + 0x18)) {
      paVar1->_M_allocated_capacity = CONCAT71(local_88._25_7_,local_88[0x18]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_88._32_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)local_88._8_8_;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_88._25_7_,local_88[0x18]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_88._16_8_;
    local_88._16_8_ = 0;
    local_88[0x18] = '\0';
    local_88._8_8_ = (Result *)(local_88 + 0x18);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  pRVar6 = (Result *)(local_88 + 0x18);
  if ((Result *)local_88._8_8_ != pRVar6) {
    operator_delete((void *)local_88._8_8_,CONCAT71(local_88._25_7_,local_88[0x18]) + 1);
    pRVar6 = extraout_RAX;
  }
  return pRVar6;
}

Assistant:

static Result validateWeightParamsUpdatable(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    
    bool weight_update_flag = false;
    bool bias_update_flag = false;
    bool has_bias = false;
    bool weights_are_quantized = false;
    bool bias_is_quantized = false;
    
    std::string err;
    
    switch (layer.layer_case()) {
        case Specification::NeuralNetworkLayer::kConvolution:
            has_bias = layer.convolution().hasbias();
            if (has_bias) {
                bias_update_flag = layer.convolution().bias().isupdatable();
                bias_is_quantized = layer.convolution().bias().has_quantization();
            }
            weights_are_quantized = layer.convolution().weights().has_quantization();
            weight_update_flag = layer.convolution().weights().isupdatable();
            break;
        case Specification::NeuralNetworkLayer::kInnerProduct:
            has_bias = layer.innerproduct().hasbias();
            if (has_bias) {
                bias_update_flag = layer.innerproduct().bias().isupdatable();
                bias_is_quantized = layer.innerproduct().bias().has_quantization();
            }
            weights_are_quantized = layer.innerproduct().weights().has_quantization();
            weight_update_flag = layer.innerproduct().weights().isupdatable();
            break;
        default:
            return r;
    }

    if (weights_are_quantized || bias_is_quantized) {
        err = "An updatable layer, named '" + layer.name() + "', has quantized weights/bias param. Quantized weights/bias not supported for update.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
    }
    
    if (!weight_update_flag || ((has_bias) && (!bias_update_flag))) {
        err = "An updatable layer, named '" + layer.name() + "', has a weight/bias param which is not marked as updatable.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
    }
    
    return r;
}